

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O2

void __thiscall raspicam::_private::Private_Impl_Still::release(Private_Impl_Still *this)

{
  if (this->_isInitialized == true) {
    disconnectPorts(this);
    destroyEncoder(this);
    destroyCamera(this);
    this->_isInitialized = false;
  }
  return;
}

Assistant:

void Private_Impl_Still::release() {
            if ( !_isInitialized ) return;

            disconnectPorts();

            // camera and encoder are not disabled here because it cause destroy function to not do its job properly

            destroyEncoder();
            destroyCamera();

            _isInitialized=false;
        }